

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar.c
# Opt level: O1

time_t get_time(int ttime)

{
  time_t tVar1;
  tm tm;
  tm local_38;
  
  local_38.tm_sec = ttime * 2 & 0x3e;
  local_38.tm_min = (uint)ttime >> 5 & 0x3f;
  local_38.tm_hour = (uint)ttime >> 0xb & 0x1f;
  local_38.tm_mday = (uint)ttime >> 0x10 & 0x1f;
  local_38.tm_mon = ((uint)ttime >> 0x15 & 0xf) - 1;
  local_38.tm_year = ((uint)ttime >> 0x19) + 0x50;
  local_38.tm_isdst = -1;
  tVar1 = mktime(&local_38);
  return tVar1;
}

Assistant:

static time_t
get_time(int ttime)
{
  struct tm tm;
  tm.tm_sec = 2 * (ttime & 0x1f);
  tm.tm_min = (ttime >> 5) & 0x3f;
  tm.tm_hour = (ttime >> 11) & 0x1f;
  tm.tm_mday = (ttime >> 16) & 0x1f;
  tm.tm_mon = ((ttime >> 21) & 0x0f) - 1;
  tm.tm_year = ((ttime >> 25) & 0x7f) + 80;
  tm.tm_isdst = -1;
  return mktime(&tm);
}